

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

Tcl_Obj * tclpkcs11_pkcs11_error(CK_RV errorCode)

{
  CK_RV errorCode_local;
  
  if (errorCode == 0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_OK OK",-1);
  }
  else if (errorCode == 1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR CANCEL",-1);
  }
  else if (errorCode == 2) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR HOST_MEMORY",-1);
  }
  else if (errorCode == 3) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SLOT_ID_INVALID",-1);
  }
  else if (errorCode == 5) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR GENERAL_ERROR",-1);
  }
  else if (errorCode == 6) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR FUNCTION_FAILED",-1);
  }
  else if (errorCode == 7) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ARGUMENTS_BAD",-1);
  }
  else if (errorCode == 8) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR NO_EVENT",-1);
  }
  else if (errorCode == 9) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR NEED_TO_CREATE_THREADS",-1);
  }
  else if (errorCode == 10) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR CANT_LOCK",-1);
  }
  else if (errorCode == 0x10) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ATTRIBUTE_READ_ONLY",-1)
    ;
  }
  else if (errorCode == 0x11) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ATTRIBUTE_SENSITIVE",-1)
    ;
  }
  else if (errorCode == 0x12) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ATTRIBUTE_TYPE_INVALID",-1);
  }
  else if (errorCode == 0x13) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ATTRIBUTE_VALUE_INVALID",-1);
  }
  else if (errorCode == 0x20) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DATA_INVALID",-1);
  }
  else if (errorCode == 0x21) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DATA_LEN_RANGE",-1);
  }
  else if (errorCode == 0x30) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DEVICE_ERROR",-1);
  }
  else if (errorCode == 0x31) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DEVICE_MEMORY",-1);
  }
  else if (errorCode == 0x32) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DEVICE_REMOVED",-1);
  }
  else if (errorCode == 0x40) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ENCRYPTED_DATA_INVALID",-1);
  }
  else if (errorCode == 0x41) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR ENCRYPTED_DATA_LEN_RANGE",-1);
  }
  else if (errorCode == 0x50) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR FUNCTION_CANCELED",-1);
  }
  else if (errorCode == 0x51) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR FUNCTION_NOT_PARALLEL",-1);
  }
  else if (errorCode == 0x54) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR FUNCTION_NOT_SUPPORTED",-1);
  }
  else if (errorCode == 0x60) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_HANDLE_INVALID",-1);
  }
  else if (errorCode == 0x62) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_SIZE_RANGE",-1);
  }
  else if (errorCode == 99) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_TYPE_INCONSISTENT",-1);
  }
  else if (errorCode == 100) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_NOT_NEEDED",-1);
  }
  else if (errorCode == 0x65) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_CHANGED",-1);
  }
  else if (errorCode == 0x66) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_NEEDED",-1);
  }
  else if (errorCode == 0x67) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_INDIGESTIBLE",-1);
  }
  else if (errorCode == 0x68) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_FUNCTION_NOT_PERMITTED",-1);
  }
  else if (errorCode == 0x69) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_NOT_WRAPPABLE",-1);
  }
  else if (errorCode == 0x6a) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR KEY_UNEXTRACTABLE",-1);
  }
  else if (errorCode == 0x70) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR MECHANISM_INVALID",-1);
  }
  else if (errorCode == 0x71) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR MECHANISM_PARAM_INVALID",-1);
  }
  else if (errorCode == 0x82) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR OBJECT_HANDLE_INVALID",-1);
  }
  else if (errorCode == 0x90) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR OPERATION_ACTIVE",-1);
  }
  else if (errorCode == 0x91) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR OPERATION_NOT_INITIALIZED",-1);
  }
  else if (errorCode == 0xa0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR PIN_INCORRECT",-1);
  }
  else if (errorCode == 0xa1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR PIN_INVALID",-1);
  }
  else if (errorCode == 0xa2) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR PIN_LEN_RANGE",-1);
  }
  else if (errorCode == 0xa3) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR PIN_EXPIRED",-1);
  }
  else if (errorCode == 0xa4) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR PIN_LOCKED",-1);
  }
  else if (errorCode == 0xb0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_CLOSED",-1);
  }
  else if (errorCode == 0xb1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_COUNT",-1);
  }
  else if (errorCode == 0xb3) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_HANDLE_INVALID",-1);
  }
  else if (errorCode == 0xb4) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_PARALLEL_NOT_SUPPORTED",-1);
  }
  else if (errorCode == 0xb5) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_READ_ONLY",-1);
  }
  else if (errorCode == 0xb6) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_EXISTS",-1);
  }
  else if (errorCode == 0xb7) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_READ_ONLY_EXISTS",-1);
  }
  else if (errorCode == 0xb8) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SESSION_READ_WRITE_SO_EXISTS",-1);
  }
  else if (errorCode == 0xc0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SIGNATURE_INVALID",-1);
  }
  else if (errorCode == 0xc1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SIGNATURE_LEN_RANGE",-1)
    ;
  }
  else if (errorCode == 0xd0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR TEMPLATE_INCOMPLETE",-1)
    ;
  }
  else if (errorCode == 0xd1) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR TEMPLATE_INCONSISTENT",-1);
  }
  else if (errorCode == 0xe0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR TOKEN_NOT_PRESENT",-1);
  }
  else if (errorCode == 0xe1) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR TOKEN_NOT_RECOGNIZED",-1);
  }
  else if (errorCode == 0xe2) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR TOKEN_WRITE_PROTECTED",-1);
  }
  else if (errorCode == 0xf0) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR UNWRAPPING_KEY_HANDLE_INVALID",-1);
  }
  else if (errorCode == 0xf1) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR UNWRAPPING_KEY_SIZE_RANGE",-1);
  }
  else if (errorCode == 0xf2) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR UNWRAPPING_KEY_TYPE_INCONSISTENT",-1)
    ;
  }
  else if (errorCode == 0x100) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_ALREADY_LOGGED_IN",-1);
  }
  else if (errorCode == 0x101) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_NOT_LOGGED_IN",-1);
  }
  else if (errorCode == 0x102) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_PIN_NOT_INITIALIZED",-1);
  }
  else if (errorCode == 0x103) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_TYPE_INVALID",-1);
  }
  else if (errorCode == 0x104) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_ANOTHER_ALREADY_LOGGED_IN",-1);
  }
  else if (errorCode == 0x105) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR USER_TOO_MANY_TYPES",-1)
    ;
  }
  else if (errorCode == 0x110) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR WRAPPED_KEY_INVALID",-1)
    ;
  }
  else if (errorCode == 0x112) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR WRAPPED_KEY_LEN_RANGE",-1);
  }
  else if (errorCode == 0x113) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR WRAPPING_KEY_HANDLE_INVALID",-1);
  }
  else if (errorCode == 0x114) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR WRAPPING_KEY_SIZE_RANGE",-1);
  }
  else if (errorCode == 0x115) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR WRAPPING_KEY_TYPE_INCONSISTENT",-1);
  }
  else if (errorCode == 0x120) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR RANDOM_SEED_NOT_SUPPORTED",-1);
  }
  else if (errorCode == 0x121) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR RANDOM_NO_RNG",-1);
  }
  else if (errorCode == 0x130) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR DOMAIN_PARAMS_INVALID",-1);
  }
  else if (errorCode == 0x150) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR BUFFER_TOO_SMALL",-1);
  }
  else if (errorCode == 0x160) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR SAVED_STATE_INVALID",-1)
    ;
  }
  else if (errorCode == 0x170) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR INFORMATION_SENSITIVE",-1);
  }
  else if (errorCode == 0x180) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR STATE_UNSAVEABLE",-1);
  }
  else if (errorCode == 400) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR CRYPTOKI_NOT_INITIALIZED",-1);
  }
  else if (errorCode == 0x191) {
    errorCode_local =
         (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR CRYPTOKI_ALREADY_INITIALIZED",-1);
  }
  else if (errorCode == 0x1a0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR MUTEX_BAD",-1);
  }
  else if (errorCode == 0x1a1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR MUTEX_NOT_LOCKED",-1);
  }
  else if (errorCode == 0x1b0) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR NEW_PIN_MODE",-1);
  }
  else if (errorCode == 0x1b1) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR NEXT_OTP",-1);
  }
  else if (errorCode == 0x200) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR FUNCTION_REJECTED",-1);
  }
  else if (errorCode == 0x80000000) {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR VENDOR_DEFINED",-1);
  }
  else {
    errorCode_local = (CK_RV)(*tclStubsPtr->tcl_NewStringObj)("PKCS11_ERROR UNKNOWN",-1);
  }
  return (Tcl_Obj *)errorCode_local;
}

Assistant:

MODULE_SCOPE Tcl_Obj *tclpkcs11_pkcs11_error(CK_RV errorCode) {
  switch (errorCode) {
    case CKR_OK:
      return(Tcl_NewStringObj("PKCS11_OK OK", -1));
    case CKR_CANCEL:
      return(Tcl_NewStringObj("PKCS11_ERROR CANCEL", -1));
    case CKR_HOST_MEMORY:
      return(Tcl_NewStringObj("PKCS11_ERROR HOST_MEMORY", -1));
    case CKR_SLOT_ID_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SLOT_ID_INVALID", -1));
    case CKR_GENERAL_ERROR:
      return(Tcl_NewStringObj("PKCS11_ERROR GENERAL_ERROR", -1));
    case CKR_FUNCTION_FAILED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_FAILED", -1));
    case CKR_ARGUMENTS_BAD:
      return(Tcl_NewStringObj("PKCS11_ERROR ARGUMENTS_BAD", -1));
    case CKR_NO_EVENT:
      return(Tcl_NewStringObj("PKCS11_ERROR NO_EVENT", -1));
    case CKR_NEED_TO_CREATE_THREADS:
      return(Tcl_NewStringObj("PKCS11_ERROR NEED_TO_CREATE_THREADS", -1));
    case CKR_CANT_LOCK:
      return(Tcl_NewStringObj("PKCS11_ERROR CANT_LOCK", -1));
    case CKR_ATTRIBUTE_READ_ONLY:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_READ_ONLY", -1));
    case CKR_ATTRIBUTE_SENSITIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_SENSITIVE", -1));
    case CKR_ATTRIBUTE_TYPE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_TYPE_INVALID", -1));
    case CKR_ATTRIBUTE_VALUE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ATTRIBUTE_VALUE_INVALID", -1));
    case CKR_DATA_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR DATA_INVALID", -1));
    case CKR_DATA_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR DATA_LEN_RANGE", -1));
    case CKR_DEVICE_ERROR:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_ERROR", -1));
    case CKR_DEVICE_MEMORY:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_MEMORY", -1));
    case CKR_DEVICE_REMOVED:
      return(Tcl_NewStringObj("PKCS11_ERROR DEVICE_REMOVED", -1));
    case CKR_ENCRYPTED_DATA_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR ENCRYPTED_DATA_INVALID", -1));
    case CKR_ENCRYPTED_DATA_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR ENCRYPTED_DATA_LEN_RANGE", -1));
    case CKR_FUNCTION_CANCELED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_CANCELED", -1));
    case CKR_FUNCTION_NOT_PARALLEL:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_NOT_PARALLEL", -1));
    case CKR_FUNCTION_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_NOT_SUPPORTED", -1));
    case CKR_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_HANDLE_INVALID", -1));
    case CKR_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_SIZE_RANGE", -1));
    case CKR_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_TYPE_INCONSISTENT", -1));
    case CKR_KEY_NOT_NEEDED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NOT_NEEDED", -1));
    case CKR_KEY_CHANGED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_CHANGED", -1));
    case CKR_KEY_NEEDED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NEEDED", -1));
    case CKR_KEY_INDIGESTIBLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_INDIGESTIBLE", -1));
    case CKR_KEY_FUNCTION_NOT_PERMITTED:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_FUNCTION_NOT_PERMITTED", -1));
    case CKR_KEY_NOT_WRAPPABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_NOT_WRAPPABLE", -1));
    case CKR_KEY_UNEXTRACTABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR KEY_UNEXTRACTABLE", -1));
    case CKR_MECHANISM_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR MECHANISM_INVALID", -1));
    case CKR_MECHANISM_PARAM_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR MECHANISM_PARAM_INVALID", -1));
    case CKR_OBJECT_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR OBJECT_HANDLE_INVALID", -1));
    case CKR_OPERATION_ACTIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR OPERATION_ACTIVE", -1));
    case CKR_OPERATION_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR OPERATION_NOT_INITIALIZED", -1));
    case CKR_PIN_INCORRECT:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_INCORRECT", -1));
    case CKR_PIN_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_INVALID", -1));
    case CKR_PIN_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_LEN_RANGE", -1));
    case CKR_PIN_EXPIRED:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_EXPIRED", -1));
    case CKR_PIN_LOCKED:
      return(Tcl_NewStringObj("PKCS11_ERROR PIN_LOCKED", -1));
    case CKR_SESSION_CLOSED:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_CLOSED", -1));
    case CKR_SESSION_COUNT:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_COUNT", -1));
    case CKR_SESSION_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_HANDLE_INVALID", -1));
    case CKR_SESSION_PARALLEL_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_PARALLEL_NOT_SUPPORTED", -1));
    case CKR_SESSION_READ_ONLY:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_ONLY", -1));
    case CKR_SESSION_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_EXISTS", -1));
    case CKR_SESSION_READ_ONLY_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_ONLY_EXISTS", -1));
    case CKR_SESSION_READ_WRITE_SO_EXISTS:
      return(Tcl_NewStringObj("PKCS11_ERROR SESSION_READ_WRITE_SO_EXISTS", -1));
    case CKR_SIGNATURE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SIGNATURE_INVALID", -1));
    case CKR_SIGNATURE_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR SIGNATURE_LEN_RANGE", -1));
    case CKR_TEMPLATE_INCOMPLETE:
      return(Tcl_NewStringObj("PKCS11_ERROR TEMPLATE_INCOMPLETE", -1));
    case CKR_TEMPLATE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR TEMPLATE_INCONSISTENT", -1));
    case CKR_TOKEN_NOT_PRESENT:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_NOT_PRESENT", -1));
    case CKR_TOKEN_NOT_RECOGNIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_NOT_RECOGNIZED", -1));
    case CKR_TOKEN_WRITE_PROTECTED:
      return(Tcl_NewStringObj("PKCS11_ERROR TOKEN_WRITE_PROTECTED", -1));
    case CKR_UNWRAPPING_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_HANDLE_INVALID", -1));
    case CKR_UNWRAPPING_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_SIZE_RANGE", -1));
    case CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR UNWRAPPING_KEY_TYPE_INCONSISTENT", -1));
    case CKR_USER_ALREADY_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_ALREADY_LOGGED_IN", -1));
    case CKR_USER_NOT_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_NOT_LOGGED_IN", -1));
    case CKR_USER_PIN_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_PIN_NOT_INITIALIZED", -1));
    case CKR_USER_TYPE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_TYPE_INVALID", -1));
    case CKR_USER_ANOTHER_ALREADY_LOGGED_IN:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_ANOTHER_ALREADY_LOGGED_IN", -1));
    case CKR_USER_TOO_MANY_TYPES:
      return(Tcl_NewStringObj("PKCS11_ERROR USER_TOO_MANY_TYPES", -1));
    case CKR_WRAPPED_KEY_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPED_KEY_INVALID", -1));
    case CKR_WRAPPED_KEY_LEN_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPED_KEY_LEN_RANGE", -1));
    case CKR_WRAPPING_KEY_HANDLE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_HANDLE_INVALID", -1));
    case CKR_WRAPPING_KEY_SIZE_RANGE:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_SIZE_RANGE", -1));
    case CKR_WRAPPING_KEY_TYPE_INCONSISTENT:
      return(Tcl_NewStringObj("PKCS11_ERROR WRAPPING_KEY_TYPE_INCONSISTENT", -1));
    case CKR_RANDOM_SEED_NOT_SUPPORTED:
      return(Tcl_NewStringObj("PKCS11_ERROR RANDOM_SEED_NOT_SUPPORTED", -1));
    case CKR_RANDOM_NO_RNG:
      return(Tcl_NewStringObj("PKCS11_ERROR RANDOM_NO_RNG", -1));
    case CKR_DOMAIN_PARAMS_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR DOMAIN_PARAMS_INVALID", -1));
    case CKR_BUFFER_TOO_SMALL:
      return(Tcl_NewStringObj("PKCS11_ERROR BUFFER_TOO_SMALL", -1));
    case CKR_SAVED_STATE_INVALID:
      return(Tcl_NewStringObj("PKCS11_ERROR SAVED_STATE_INVALID", -1));
    case CKR_INFORMATION_SENSITIVE:
      return(Tcl_NewStringObj("PKCS11_ERROR INFORMATION_SENSITIVE", -1));
    case CKR_STATE_UNSAVEABLE:
      return(Tcl_NewStringObj("PKCS11_ERROR STATE_UNSAVEABLE", -1));
    case CKR_CRYPTOKI_NOT_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR CRYPTOKI_NOT_INITIALIZED", -1));
    case CKR_CRYPTOKI_ALREADY_INITIALIZED:
      return(Tcl_NewStringObj("PKCS11_ERROR CRYPTOKI_ALREADY_INITIALIZED", -1));
    case CKR_MUTEX_BAD:
      return(Tcl_NewStringObj("PKCS11_ERROR MUTEX_BAD", -1));
    case CKR_MUTEX_NOT_LOCKED:
      return(Tcl_NewStringObj("PKCS11_ERROR MUTEX_NOT_LOCKED", -1));
    case CKR_NEW_PIN_MODE:
      return(Tcl_NewStringObj("PKCS11_ERROR NEW_PIN_MODE", -1));
    case CKR_NEXT_OTP:
      return(Tcl_NewStringObj("PKCS11_ERROR NEXT_OTP", -1));
    case CKR_FUNCTION_REJECTED:
      return(Tcl_NewStringObj("PKCS11_ERROR FUNCTION_REJECTED", -1));
    case CKR_VENDOR_DEFINED:
      return(Tcl_NewStringObj("PKCS11_ERROR VENDOR_DEFINED", -1));
  }

  return(Tcl_NewStringObj("PKCS11_ERROR UNKNOWN", -1));
}